

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membank_factory.cpp
# Opt level: O2

MemBankList *
n_e_s::core::MemBankFactory::create_nes_ppu_mem_banks(MemBankList *__return_storage_ptr__,IRom *rom)

{
  _Head_base<0UL,_n_e_s::core::IMemBank_*,_false> local_20;
  _Head_base<0UL,_n_e_s::core::MemBank<(unsigned_short)16128,_(unsigned_short)16383,_(unsigned_short)32>_*,_false>
  local_18;
  
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_20._M_head_impl = (IMemBank *)operator_new(0x10);
  (local_20._M_head_impl)->_vptr_IMemBank = (_func_int **)&PTR__IMemBank_00130e68;
  local_20._M_head_impl[1]._vptr_IMemBank = (_func_int **)rom;
  std::
  vector<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>,std::allocator<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>>>
  ::emplace_back<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>>
            ((vector<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>,std::allocator<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>>>
              *)__return_storage_ptr__,
             (unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_> *)
             &local_20);
  if (local_20._M_head_impl != (IMemBank *)0x0) {
    (*(local_20._M_head_impl)->_vptr_IMemBank[1])();
  }
  std::
  make_unique<n_e_s::core::MemBank<(unsigned_short)16128,(unsigned_short)16383,(unsigned_short)32>>
            ();
  local_20._M_head_impl = (IMemBank *)local_18._M_head_impl;
  local_18._M_head_impl =
       (MemBank<(unsigned_short)16128,_(unsigned_short)16383,_(unsigned_short)32> *)0x0;
  std::
  vector<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>,std::allocator<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>>>
  ::emplace_back<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>>
            ((vector<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>,std::allocator<std::unique_ptr<n_e_s::core::IMemBank,std::default_delete<n_e_s::core::IMemBank>>>>
              *)__return_storage_ptr__,
             (unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_> *)
             &local_20);
  if (local_20._M_head_impl != (IMemBank *)0x0) {
    (*(local_20._M_head_impl)->_vptr_IMemBank[1])();
  }
  local_20._M_head_impl = (IMemBank *)0x0;
  std::
  unique_ptr<n_e_s::core::MemBank<(unsigned_short)16128,_(unsigned_short)16383,_(unsigned_short)32>,_std::default_delete<n_e_s::core::MemBank<(unsigned_short)16128,_(unsigned_short)16383,_(unsigned_short)32>_>_>
  ::~unique_ptr((unique_ptr<n_e_s::core::MemBank<(unsigned_short)16128,_(unsigned_short)16383,_(unsigned_short)32>,_std::default_delete<n_e_s::core::MemBank<(unsigned_short)16128,_(unsigned_short)16383,_(unsigned_short)32>_>_>
                 *)&local_18);
  return __return_storage_ptr__;
}

Assistant:

MemBankList MemBankFactory::create_nes_ppu_mem_banks(IRom *rom) {
    MemBankList mem_banks;

    // Rom, make sure this is first so the mapper can decide if it wants to
    // handle the address or not.
    mem_banks.push_back(std::make_unique<PpuRomTranslator>(rom));

    // Palettes
    mem_banks.push_back(std::make_unique<MemBank<0x3F00, 0x3FFF, 0x20>>());

    return mem_banks;
}